

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingGeneric::ChLoadXYZROTnodeBodyBushingGeneric
          (ChLoadXYZROTnodeBodyBushingGeneric *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA
          ,shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application,
          ChMatrixConstRef mstiffness,ChMatrixConstRef mdamping)

{
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_50 [24];
  double local_38;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZROTnodeBody::ChLoadXYZROTnodeBody
            (&this->super_ChLoadXYZROTnodeBody,(shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_78
             ,(shared_ptr<chrono::ChBody> *)&local_88,abs_application);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  (this->super_ChLoadXYZROTnodeBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZROTnodeBodyBushingGeneric_01177588;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>>::
  _set_noalias<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>> *)&this->stiffness,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)mstiffness);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>>::
  _set_noalias<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>> *)&this->damping,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)mdamping);
  (this->neutral_force).m_data[2] = 0.0;
  (this->neutral_torque).m_data[0] = 0.0;
  (this->neutral_torque).m_data[1] = 0.0;
  (this->neutral_torque).m_data[2] = 0.0;
  (this->neutral_force).m_data[0] = 0.0;
  (this->neutral_force).m_data[1] = 0.0;
  (this->neutral_force).m_data[2] = 0.0;
  (this->neutral_torque).m_data[0] = 0.0;
  local_50._0_8_ = 1.0;
  local_58 = 0.0;
  local_38 = 0.0;
  local_68 = ZEXT416(0) << 0x40;
  local_50._8_16_ = local_68;
  ChFrame<double>::ChFrame
            (&this->neutral_displacement,(ChVector<double> *)local_68,
             (ChQuaternion<double> *)local_50);
  return;
}

Assistant:

ChLoadXYZROTnodeBodyBushingGeneric::ChLoadXYZROTnodeBodyBushingGeneric(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,
                                                                       std::shared_ptr<ChBody> mbodyB,
                                                                       const ChFrame<>& abs_application,
                                                                       ChMatrixConstRef mstiffness,
                                                                       ChMatrixConstRef mdamping)
    : ChLoadXYZROTnodeBody(mnodeA, mbodyB, abs_application), stiffness(mstiffness), damping(mdamping) {}